

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-server.c
# Opt level: O0

int lws_ssl_server_name_cb(SSL *ssl,int *ad,void *arg)

{
  SSL_CTX *pSVar1;
  SSL_CTX *pSVar2;
  char *servername_00;
  lws_vhost *plVar3;
  char *servername;
  lws_vhost *vh;
  lws_vhost *vhost;
  lws_context *context;
  void *arg_local;
  int *ad_local;
  SSL *ssl_local;
  
  if (ssl == (SSL *)0x0) {
    ssl_local._4_4_ = 3;
  }
  else {
    for (servername = *(char **)((long)arg + 0x420);
        (servername != (char *)0x0 &&
        ((((byte)servername[0x2b4] >> 2 & 1) != 0 ||
         (pSVar1 = *(SSL_CTX **)(servername + 0x218), pSVar2 = SSL_get_SSL_CTX((SSL *)ssl),
         pSVar1 != pSVar2)))); servername = *(char **)(servername + 0x150)) {
    }
    if (servername == (char *)0x0) {
      __assert_fail("vh",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/tls/openssl/openssl-server.c"
                    ,0x78,"int lws_ssl_server_name_cb(SSL *, int *, void *)");
    }
    servername_00 = SSL_get_servername((SSL *)ssl,0);
    if (servername_00 == (char *)0x0) {
      _lws_log(8,"SNI: Unknown ServerName\n");
      ssl_local._4_4_ = 0;
    }
    else {
      plVar3 = lws_select_vhost((lws_context *)arg,*(int *)(servername + 0x290),servername_00);
      if (plVar3 == (lws_vhost *)0x0) {
        _lws_log(8,"SNI: none: %s:%d\n",servername_00,(ulong)*(uint *)(servername + 0x290));
        ssl_local._4_4_ = 0;
      }
      else {
        _lws_log(8,"SNI: Found: %s:%d\n",servername_00,(ulong)*(uint *)(servername + 0x290));
        SSL_set_SSL_CTX((SSL *)ssl,(SSL_CTX *)(plVar3->tls).ssl_ctx);
        ssl_local._4_4_ = 0;
      }
    }
  }
  return ssl_local._4_4_;
}

Assistant:

static int
lws_ssl_server_name_cb(SSL *ssl, int *ad, void *arg)
{
	struct lws_context *context = (struct lws_context *)arg;
	struct lws_vhost *vhost, *vh;
	const char *servername;

	if (!ssl)
		return SSL_TLSEXT_ERR_NOACK;

	/*
	 * We can only get ssl accepted connections by using a vhost's ssl_ctx
	 * find out which listening one took us and only match vhosts on the
	 * same port.
	 */
	vh = context->vhost_list;
	while (vh) {
		if (!vh->being_destroyed &&
		    vh->tls.ssl_ctx == SSL_get_SSL_CTX(ssl))
			break;
		vh = vh->vhost_next;
	}

	if (!vh) {
		assert(vh); /* can't match the incoming vh? */
		return SSL_TLSEXT_ERR_OK;
	}

	servername = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);
	if (!servername) {
		/* the client doesn't know what hostname it wants */
		lwsl_info("SNI: Unknown ServerName\n");

		return SSL_TLSEXT_ERR_OK;
	}

	vhost = lws_select_vhost(context, vh->listen_port, servername);
	if (!vhost) {
		lwsl_info("SNI: none: %s:%d\n", servername, vh->listen_port);

		return SSL_TLSEXT_ERR_OK;
	}

	lwsl_info("SNI: Found: %s:%d\n", servername, vh->listen_port);

	/* select the ssl ctx from the selected vhost for this conn */
	SSL_set_SSL_CTX(ssl, vhost->tls.ssl_ctx);

	return SSL_TLSEXT_ERR_OK;
}